

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# case_simplification.cpp
# Opt level: O2

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::CaseSimplificationRule::Apply
          (CaseSimplificationRule *this,LogicalOperator *op,
          vector<std::reference_wrapper<duckdb::Expression>,_true> *bindings,bool *changes_made,
          bool is_root)

{
  vector<duckdb::BoundCaseCheck,_true> *this_00;
  bool bVar1;
  int iVar2;
  reference pvVar3;
  BoundCaseExpression *pBVar4;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *this_01;
  reference this_02;
  pointer pEVar5;
  ClientContext *context;
  type expr;
  long lVar6;
  pointer pBVar7;
  pointer pBVar8;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var9;
  ulong __n;
  LogicalType local_c8;
  Value condition;
  Value constant_value;
  
  __n = 0;
  pvVar3 = vector<std::reference_wrapper<duckdb::Expression>,_true>::get<true>
                     ((vector<std::reference_wrapper<duckdb::Expression>,_true> *)changes_made,0);
  pBVar4 = BaseExpression::Cast<duckdb::BoundCaseExpression>(&pvVar3->_M_data->super_BaseExpression)
  ;
  this_00 = &pBVar4->case_checks;
  this_01 = &pBVar4->else_expr;
  do {
    pBVar7 = (pBVar4->case_checks).
             super_vector<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>.
             super__Vector_base<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pBVar8 = (pBVar4->case_checks).
             super_vector<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>.
             super__Vector_base<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)((long)pBVar8 - (long)pBVar7 >> 4) <= __n) {
LAB_005882ce:
      if (pBVar7 == pBVar8) {
        _Var9._M_head_impl =
             (this_01->
             super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
             super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
             super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
        (this_01->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
        _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
        _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
      }
      else {
        _Var9._M_head_impl = (Expression *)0x0;
      }
      (this->super_Rule)._vptr_Rule = (_func_int **)_Var9._M_head_impl;
      return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
    }
    this_02 = vector<duckdb::BoundCaseCheck,_true>::get<true>(this_00,__n);
    pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(&this_02->when_expr);
    iVar2 = (*(pEVar5->super_BaseExpression)._vptr_BaseExpression[0xf])(pEVar5);
    if ((char)iVar2 != '\0') {
      context = Rule::GetContext((Rule *)op);
      expr = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator*(&this_02->when_expr);
      ExpressionExecutor::EvaluateScalar(&constant_value,context,expr,false);
      LogicalType::LogicalType(&local_c8,BOOLEAN);
      Value::DefaultCastAs(&condition,&constant_value,&local_c8,false);
      LogicalType::~LogicalType(&local_c8);
      if (condition.is_null == false) {
        bVar1 = BooleanValue::Get(&condition);
        if (!bVar1) goto LAB_00588294;
        ::std::__uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>::
        operator=((__uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_> *)
                  this_01,(__uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                           *)&this_02->then_expr);
        pBVar7 = (this_00->
                 super_vector<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>).
                 super__Vector_base<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar6 = NumericCastImpl<long,_unsigned_long,_false>::Convert(__n);
        ::std::vector<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>::erase
                  (&this_00->
                    super_vector<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>,
                   pBVar7 + lVar6,
                   (pBVar4->case_checks).
                   super_vector<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>.
                   super__Vector_base<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        bVar1 = false;
      }
      else {
LAB_00588294:
        vector<duckdb::BoundCaseCheck,_true>::erase_at(this_00,__n);
        __n = __n - 1;
        bVar1 = true;
      }
      Value::~Value(&condition);
      Value::~Value(&constant_value);
      if (!bVar1) {
        pBVar7 = (pBVar4->case_checks).
                 super_vector<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>.
                 super__Vector_base<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pBVar8 = (pBVar4->case_checks).
                 super_vector<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>.
                 super__Vector_base<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        goto LAB_005882ce;
      }
    }
    __n = __n + 1;
  } while( true );
}

Assistant:

unique_ptr<Expression> CaseSimplificationRule::Apply(LogicalOperator &op, vector<reference<Expression>> &bindings,
                                                     bool &changes_made, bool is_root) {
	auto &root = bindings[0].get().Cast<BoundCaseExpression>();
	for (idx_t i = 0; i < root.case_checks.size(); i++) {
		auto &case_check = root.case_checks[i];
		if (case_check.when_expr->IsFoldable()) {
			// the WHEN check is a foldable expression
			// use an ExpressionExecutor to execute the expression
			auto constant_value = ExpressionExecutor::EvaluateScalar(GetContext(), *case_check.when_expr);

			// fold based on the constant condition
			auto condition = constant_value.DefaultCastAs(LogicalType::BOOLEAN);
			if (condition.IsNull() || !BooleanValue::Get(condition)) {
				// the condition is always false: remove this case check
				root.case_checks.erase_at(i);
				i--;
			} else {
				// the condition is always true
				// move the THEN clause to the ELSE of the case
				root.else_expr = std::move(case_check.then_expr);
				// remove this case check and any case checks after this one
				root.case_checks.erase(root.case_checks.begin() + NumericCast<int64_t>(i), root.case_checks.end());
				break;
			}
		}
	}
	if (root.case_checks.empty()) {
		// no case checks left: return the ELSE expression
		return std::move(root.else_expr);
	}
	return nullptr;
}